

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Environmental_Process_PDU::operator==
          (Environmental_Process_PDU *this,Environmental_Process_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Environmental_Process_PDU *Value_local;
  Environmental_Process_PDU *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EnvProcID,&Value->m_EnvProcID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::EnvironmentType::operator!=(&this->m_EnvType,&Value->m_EnvType);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else if (this->m_ui8ModelType == Value->m_ui8ModelType) {
        if ((this->field_3).m_ui8EnvStatus == (Value->field_3).m_ui8EnvStatus) {
          if (this->m_ui16NumEnvRec == Value->m_ui16NumEnvRec) {
            if (this->m_ui16SeqNum == Value->m_ui16SeqNum) {
              bVar2 = std::operator!=(&this->m_vEnvRecords,&Value->m_vEnvRecords);
              if (bVar2) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Environmental_Process_PDU::operator == ( const Environmental_Process_PDU & Value ) const
{
    if( Header::operator != ( Value ) )             return false;
    if( m_EnvProcID      != Value.m_EnvProcID )     return false;
    if( m_EnvType        != Value.m_EnvType )       return false;
    if( m_ui8ModelType   != Value.m_ui8ModelType )  return false;
    if( m_ui8EnvStatus   != Value.m_ui8EnvStatus )  return false;
    if( m_ui16NumEnvRec  != Value.m_ui16NumEnvRec ) return false;
    if( m_ui16SeqNum     != Value.m_ui16SeqNum )    return false;
    if( m_vEnvRecords    != Value.m_vEnvRecords )   return false;
    return true;
}